

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *
detail::
deserialize_helper<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
::apply(vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
        *__return_storage_ptr__,const_iterator *begin,const_iterator end)

{
  unsigned_long __n;
  pair<unsigned_int,_float> pVar1;
  size_t i;
  unsigned_long uVar2;
  allocator_type local_29;
  
  __n = deserialize_helper<unsigned_long>::apply(begin,end);
  std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
  vector(__return_storage_ptr__,__n,&local_29);
  for (uVar2 = 0; __n != uVar2; uVar2 = uVar2 + 1) {
    pVar1 = deserialize_helper<std::pair<unsigned_int,_float>_>::apply(begin,end);
    (__return_storage_ptr__->
    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
    )._M_impl.super__Vector_impl_data._M_start[uVar2] = pVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<T> apply(StreamType::const_iterator& begin,
                                    StreamType::const_iterator end)
        {
            // retrieve the number of elements
            size_t size = deserialize_helper<size_t>::apply(begin, end);

            std::vector<T> vect(size);
            for (size_t i = 0; i < size; ++i)
            {
                vect[i] = std::move(deserialize_helper<T>::apply(begin, end));
            }
            return vect;
        }